

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

int Diligent::Parsing::GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *End,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *NameEnd)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  int Index;
  undefined4 uStack_2c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  _Var1 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(Start,End);
  NameEnd->_M_current = (char *)_Var1;
  if (_Var1._M_current != Start->_M_current) {
    if (_Var1._M_current == End->_M_current) {
      return -1;
    }
    _Index = SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       (NameEnd,End," \t");
    if (_Index == End->_M_current) {
      return -0x80000000;
    }
    if (*_Index != '[') {
      return -0x80000000;
    }
    _Index = _Index + 1;
    local_28 = SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&Index,End," \t");
    if (local_28._M_current == End->_M_current) {
      return -0x80000000;
    }
    Index = 0x80000000;
    local_28 = ParseInteger<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
                         (&local_28,End,&Index);
    _Var1 = SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&local_28,End," \t");
    if (_Var1._M_current != End->_M_current) {
      if (*_Var1._M_current != ']') {
        return -0x80000000;
      }
      return Index;
    }
  }
  return -0x80000000;
}

Assistant:

inline int GetArrayIndex(const InteratorType& Start, const InteratorType& End, InteratorType& NameEnd)
{
    NameEnd = SkipIdentifier(Start, End);
    // Empty name is not a valid identifier
    if (NameEnd == Start)
    {
        //
        //  ^
        return InvalidArrayIndex;
    }

    if (NameEnd == End)
    {
        // MyArray
        //        ^
        return -1;
    }
    // MyArray [ 16 ]
    //        ^

    auto Pos = SkipDelimiters(NameEnd, End, " \t");
    // MyArray [ 16 ]
    //         ^
    if (Pos == End || *Pos != '[')
        return InvalidArrayIndex;

    Pos = SkipDelimiters(Pos + 1, End, " \t");
    // MyArray [ 16 ]
    //           ^
    if (Pos == End)
        return InvalidArrayIndex;

    int Index = InvalidArrayIndex;
    Pos       = ParseInteger(Pos, End, Index);
    // MyArray [ 16 ]
    //             ^

    Pos = SkipDelimiters(Pos, End, " \t");
    // MyArray [ 16 ]
    //              ^
    return (Pos != End && *Pos == ']') ? Index : InvalidArrayIndex;
}